

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ScrollArea::ensureVisible(ScrollArea *this,int x,int y,int xmargin,int ymargin)

{
  LayoutDirection LVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QPoint *pQVar6;
  int *piVar7;
  QSize *pQVar8;
  QPoint local_7c;
  int local_74;
  int local_70;
  int local_6c [3];
  int local_60;
  int local_5c [4];
  int posY;
  int posX;
  QRect local_44;
  QPoint local_34;
  int local_2c;
  ScrollAreaPrivate *pSStack_28;
  int logicalX;
  ScrollAreaPrivate *d;
  int ymargin_local;
  int xmargin_local;
  int y_local;
  int x_local;
  ScrollArea *this_local;
  
  d._0_4_ = ymargin;
  d._4_4_ = xmargin;
  ymargin_local = y;
  xmargin_local = x;
  _y_local = this;
  pSStack_28 = d_func(this);
  LVar1 = QWidget::layoutDirection();
  local_44 = QWidget::rect((pSStack_28->super_AbstractScrollAreaPrivate).viewport);
  QPoint::QPoint((QPoint *)&posY,xmargin_local,ymargin_local);
  local_34 = (QPoint)QStyle::visualPos(LVar1,(QRect *)&local_44,(QPoint *)&posY);
  local_2c = QPoint::x(&local_34);
  local_5c[3] = 0;
  local_5c[2] = 0;
  iVar2 = local_2c - d._4_4_;
  pQVar6 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  iVar3 = QPoint::x(pQVar6);
  iVar5 = local_2c;
  if (iVar2 < iVar3) {
    local_5c[1] = 0;
    local_5c[0] = local_2c - d._4_4_;
    piVar7 = qMax<int>(local_5c + 1,local_5c);
    local_5c[3] = *piVar7;
  }
  else {
    pQVar6 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar3 = QPoint::x(pQVar6);
    iVar4 = QWidget::width((pSStack_28->super_AbstractScrollAreaPrivate).viewport);
    iVar2 = local_2c;
    if ((iVar3 + iVar4) - d._4_4_ < iVar5) {
      iVar5 = QWidget::width((pSStack_28->super_AbstractScrollAreaPrivate).viewport);
      local_60 = (iVar2 - iVar5) + d._4_4_;
      pQVar8 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      local_6c[2] = QSize::width(pQVar8);
      piVar7 = qMin<int>(&local_60,local_6c + 2);
      local_5c[3] = *piVar7;
    }
  }
  iVar2 = ymargin_local - (int)d;
  pQVar6 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  iVar3 = QPoint::y(pQVar6);
  iVar5 = ymargin_local;
  if (iVar2 < iVar3) {
    local_6c[1] = 0;
    local_6c[0] = ymargin_local - (int)d;
    piVar7 = qMax<int>(local_6c + 1,local_6c);
    local_5c[2] = *piVar7;
  }
  else {
    pQVar6 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar3 = QPoint::y(pQVar6);
    iVar4 = QWidget::height((pSStack_28->super_AbstractScrollAreaPrivate).viewport);
    iVar2 = ymargin_local;
    if ((iVar3 + iVar4) - (int)d < iVar5) {
      iVar5 = QWidget::height((pSStack_28->super_AbstractScrollAreaPrivate).viewport);
      local_70 = (iVar2 - iVar5) + (int)d;
      pQVar8 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      local_74 = QSize::height(pQVar8);
      piVar7 = qMin<int>(&local_70,&local_74);
      local_5c[2] = *piVar7;
    }
  }
  QPoint::QPoint(&local_7c,local_5c[3],local_5c[2]);
  AbstractScrollArea::setTopLeftPointShownArea(&this->super_AbstractScrollArea,&local_7c);
  return;
}

Assistant:

void
ScrollArea::ensureVisible( int x, int y, int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	int logicalX = QStyle::visualPos( layoutDirection(), d->viewport->rect(),
		QPoint( x, y ) ).x();

	int posX = 0;
	int posY = 0;

	if( logicalX - xmargin < topLeftPointShownArea().x() )
		posX = qMax( 0, logicalX - xmargin );
	else if( logicalX > topLeftPointShownArea().x() + d->viewport->width() - xmargin )
		posX = qMin( logicalX - d->viewport->width() + xmargin,
			scrolledAreaSize().width() );

	if( y - ymargin < topLeftPointShownArea().y() )
		posY = qMax( 0, y - ymargin );
	else if( y > topLeftPointShownArea().y() + d->viewport->height() - ymargin )
		posY= qMin( y - d->viewport->height() + ymargin,
			scrolledAreaSize().height() );

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}